

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void rnn_prepdb(rnndb *db)

{
  long in_RDI;
  rnndomain *in_stack_00000008;
  int i;
  rnnspectype *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x28); iVar1 = iVar1 + 1) {
    prepenum(db,(rnnenum *)in_stack_00000008);
  }
  for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x38); iVar1 = iVar1 + 1) {
    prepbitset(db,(rnnbitset *)in_stack_00000008);
  }
  for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x48); iVar1 = iVar1 + 1) {
    prepdomain(db,in_stack_00000008);
  }
  for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x68); iVar1 = iVar1 + 1) {
    prepspectype((rnndb *)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void rnn_prepdb (struct rnndb *db) {
	int i;
	for (i = 0; i < db->enumsnum; i++)
		prepenum(db, db->enums[i]);
	for (i = 0; i < db->bitsetsnum; i++)
		prepbitset(db, db->bitsets[i]);
	for (i = 0; i < db->domainsnum; i++)
		prepdomain(db, db->domains[i]);
	for (i = 0; i < db->spectypesnum; i++)
		prepspectype(db, db->spectypes[i]);
}